

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mml.c
# Opt level: O1

int mml_get_value(char **ptr)

{
  ushort **ppuVar1;
  uint uVar2;
  char *pcVar3;
  long lVar4;
  
  ppuVar1 = __ctype_b_loc();
  pcVar3 = *ptr;
  lVar4 = (long)*pcVar3;
  uVar2 = 0;
  if ((*(byte *)((long)*ppuVar1 + lVar4 * 2 + 1) & 8) != 0) {
    uVar2 = 0;
    do {
      pcVar3 = pcVar3 + 1;
      if (0xffff < uVar2) {
        return -1;
      }
      uVar2 = ((int)(char)lVar4 + uVar2 * 10) - 0x30;
      *ptr = pcVar3;
      lVar4 = (long)*pcVar3;
    } while ((*(byte *)((long)*ppuVar1 + lVar4 * 2 + 1) & 8) != 0);
  }
  return uVar2;
}

Assistant:

int
mml_get_value(char **ptr)
{
	unsigned int value;
	char c;

	/* get value */
	value = 0;

	for (;;) {
		c = **ptr;

		if (!isdigit(c))
			break;
		if (value > 65535)
			return (-1);

		value = (value * 10) + (c - '0');
		(*ptr)++;
	}

	/* ok */
	return (value);
}